

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Index __thiscall wasm::Wasm2JSBuilder::getDataIndex(Wasm2JSBuilder *this,Name segment)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_30;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_28;
  iterator it;
  Wasm2JSBuilder *this_local;
  Name segment_local;
  
  segment_local.super_IString.str._M_len = segment.super_IString.str._M_str;
  this_local = segment.super_IString.str._M_len;
  it.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>)this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
       ::find(&this->dataIndices,(key_type *)&this_local);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
       ::end(&this->dataIndices);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (!bVar1) {
    __assert_fail("it != dataIndices.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                  ,199,"Index wasm::Wasm2JSBuilder::getDataIndex(Name)");
  }
  ppVar2 = std::__detail::_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>::
           operator->((_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true> *)
                      &local_28);
  return ppVar2->second;
}

Assistant:

Index getDataIndex(Name segment) {
    auto it = dataIndices.find(segment);
    assert(it != dataIndices.end());
    return it->second;
  }